

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSupMin.c
# Opt level: O2

void Gia_ManSupExperiment(Gia_Man_t *pGia,Vec_Int_t *vPairs)

{
  uint uVar1;
  int iVar2;
  Gia_ManSup_t *p;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Gia_ManSup_t *pGVar6;
  int i;
  
  pGVar6 = (Gia_ManSup_t *)0x10;
  p = Gia_ManSupStart(0x10);
  p->pGia = pGia;
  uVar1 = vPairs->nSize;
  if ((uVar1 & 1) == 0) {
    i = 1;
    uVar5 = 0;
    while( true ) {
      if ((int)uVar1 / 2 <= (int)uVar5) break;
      Abc_Print((int)pGVar6,"%6d : ",(ulong)uVar5);
      iVar2 = Vec_IntEntry(vPairs,i + -1);
      pGVar3 = Gia_ManPo(pGia,iVar2);
      iVar2 = Vec_IntEntry(vPairs,i);
      pGVar4 = Gia_ManPo(pGia,iVar2);
      pGVar6 = p;
      Gia_ManSupExperimentOne
                (p,(Gia_Obj_t *)
                   ((ulong)((uint)(*(ulong *)pGVar3 >> 0x1d) & 1) ^
                   (ulong)(pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff))),
                 (Gia_Obj_t *)
                 ((ulong)((uint)(*(ulong *)pGVar4 >> 0x1d) & 1) ^
                 (ulong)(pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff))));
      uVar5 = uVar5 + 1;
      uVar1 = vPairs->nSize;
      i = i + 2;
    }
    Gia_ManSupStop(p);
    return;
  }
  __assert_fail("Vec_IntSize(vPairs) % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSupMin.c"
                ,0x94,"void Gia_ManSupExperiment(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManSupExperiment( Gia_Man_t * pGia, Vec_Int_t * vPairs )
{
    Gia_ManSup_t * p;
    Gia_Obj_t * pData, * pCare;
    int i;
    p = Gia_ManSupStart( 16 );
    p->pGia = pGia;
    assert( Vec_IntSize(vPairs) % 2 == 0 );
    for ( i = 0; i < Vec_IntSize(vPairs)/2; i++ )
    {
        Abc_Print( 1, "%6d : ", i );
        pData = Gia_ManPo( pGia, Vec_IntEntry(vPairs, 2*i+0) );
        pCare = Gia_ManPo( pGia, Vec_IntEntry(vPairs, 2*i+1) );
        Gia_ManSupExperimentOne( p, Gia_ObjChild0(pData), Gia_ObjChild0(pCare) );
    }
    Gia_ManSupStop( p );
}